

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O2

int __thiscall ExternalCodeEditor::remove_tmpfile(ExternalCodeEditor *this)

{
  char *filename;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  
  filename = this->filename_;
  if (filename == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = is_file(filename);
    if (iVar1 != 0) {
      if (G_debug != 0) {
        printf("Removing tmpfile \'%s\'\n");
      }
      iVar1 = remove(filename);
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fl_alert("WARNING: Can\'t remove() \'%s\': %s",filename,pcVar3);
        return -1;
      }
    }
    set_filename(this,(char *)0x0);
    this->file_mtime_ = 0;
    this->file_size_ = 0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int is_dir(const char *dirname) {
  struct stat buf;
  if ( stat(dirname, &buf) < 0 ) return(0);
  return(S_ISDIR(buf.st_mode) ? 1 : 0);     // a dir?
}